

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall
front::symbol::IntSymbol::IntSymbol
          (IntSymbol *this,string *name,int layer_num,bool is_const,int value)

{
  int iVar1;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Symbol::Symbol(&this->super_Symbol,&sStack_48,layer_num);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001daad8;
  this->_is_const = is_const;
  this->_value = value;
  this->_size = 4;
  iVar1 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

IntSymbol(string name, int layer_num, bool is_const, int value = 0)
      : _is_const(is_const), _value(value), Symbol(name, layer_num) {
    id = Symbol::symbolId++;
  }